

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O0

void TPZShapeHDivConstant<pzshape::TPZShapeQuad>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  int iVar1;
  int64_t iVar2;
  double *pdVar3;
  int *piVar4;
  long *in_RCX;
  long in_RSI;
  double dVar5;
  int i_1;
  int j;
  int i;
  int countKernel;
  int count;
  int nEdges;
  int nshape;
  TPZVec<double> div;
  TPZFNMatrix<12,_double> vecDiv;
  int nfacets;
  int dim;
  int nsides;
  int ncorner;
  TPZShapeData *in_stack_00001178;
  TPZVec<double> *in_stack_00001180;
  int64_t in_stack_fffffffffffffd78;
  TPZFMatrix<double> *in_stack_fffffffffffffd80;
  double *in_stack_fffffffffffffd90;
  _func_int **in_stack_fffffffffffffd98;
  TPZFNMatrix<12,_double> *in_stack_fffffffffffffda0;
  int64_t in_stack_fffffffffffffdb8;
  int64_t in_stack_fffffffffffffdc0;
  double *in_stack_fffffffffffffdc8;
  TPZVec<double> *in_stack_fffffffffffffdd0;
  TPZFMatrix<double> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int iVar6;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  TPZVec<double> local_148 [8];
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long *local_20;
  long local_10;
  
  local_24 = 4;
  local_28 = 9;
  local_2c = 2;
  local_30 = 4;
  local_20 = in_RCX;
  local_10 = in_RSI;
  TPZFNMatrix<12,_double>::TPZFNMatrix
            (in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,
             (int64_t)in_stack_fffffffffffffd90);
  TPZVec<double>::TPZVec((TPZVec<double> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  TPZFMatrix<double>::Zero(in_stack_fffffffffffffd80);
  TPZVec<double>::Fill
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  pztopology::TPZQuadrilateral::ComputeConstantHDiv
            ((TPZVec<double> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x22a0));
  TPZShapeH1<pzshape::TPZShapeQuad>::Shape(in_stack_00001180,in_stack_00001178);
  (**(code **)(*local_20 + 0x78))();
  iVar1 = pztopology::TPZQuadrilateral::NumSides(0x18b7f06);
  local_170 = 4;
  for (local_174 = 0; local_174 < iVar1; local_174 = local_174 + 1) {
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    dVar5 = *pdVar3;
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x2c70),(long)local_174);
    iVar6 = *piVar4;
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    *pdVar3 = dVar5 * (double)iVar6;
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    dVar5 = *pdVar3;
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x2c70),(long)local_174);
    iVar6 = *piVar4;
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    *pdVar3 = dVar5 * (double)iVar6;
    pdVar3 = TPZVec<double>::operator[](local_148,(long)local_174);
    dVar5 = *pdVar3;
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x2c70),(long)local_174);
    iVar6 = *piVar4;
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    *pdVar3 = dVar5 * (double)iVar6;
    local_178 = 1;
    while( true ) {
      iVar6 = local_178;
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x2b50),(long)local_174);
      if (*piVar4 <= iVar6) break;
      pdVar3 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
      dVar5 = -*pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
      *pdVar3 = dVar5;
      pdVar3 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
      *pdVar3 = dVar5;
      local_170 = local_170 + 1;
      local_178 = local_178 + 1;
    }
  }
  for (local_17c = local_170; local_17c < (int)iVar2; local_17c = local_17c + 1) {
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd98 = (_func_int **)((ulong)*pdVar3 ^ 0x8000000000000000);
    in_stack_fffffffffffffda0 =
         (TPZFNMatrix<12,_double> *)
         TPZFMatrix<double>::operator()
                   (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                    (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    (in_stack_fffffffffffffda0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffffd98;
    in_stack_fffffffffffffd90 =
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)in_stack_fffffffffffffda0,
                    (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd80 = (TPZFMatrix<double> *)*in_stack_fffffffffffffd90;
    pdVar3 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    *pdVar3 = (double)in_stack_fffffffffffffd80;
  }
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffd80);
  TPZFNMatrix<12,_double>::~TPZFNMatrix((TPZFNMatrix<12,_double> *)0x18b847e);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}